

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O2

void __thiscall duckdb::Bit::ToBit(Bit *this,string_t str,bitstring_t *output_str)

{
  char *pcVar1;
  bitstring_t *str_00;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  idx_t bit_idx;
  long lVar6;
  idx_t i;
  ulong uVar7;
  string_t str_local;
  
  str_00 = str.value._8_8_;
  str_local.value.pointer.ptr = str.value._0_8_;
  pcVar2 = str.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar2 = str_local.value.pointer.prefix;
  }
  uVar3 = (uint)this & 7;
  uVar4 = (ulong)uVar3;
  bVar5 = 0;
  for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    bVar5 = bVar5 * '\x02' | pcVar2[uVar7] == '1';
  }
  pcVar1 = (str_00->value).pointer.ptr;
  if ((str_00->value).pointer.length < 0xd) {
    pcVar1 = (str_00->value).pointer.prefix;
  }
  if (uVar4 != 0) {
    *pcVar1 = '\b' - (char)uVar3;
    pcVar1 = pcVar1 + 1;
  }
  *pcVar1 = bVar5;
  pcVar2 = pcVar2 + uVar4;
  for (; uVar4 < ((ulong)this & 0xffffffff); uVar4 = uVar4 + 8) {
    pcVar1 = pcVar1 + 1;
    bVar5 = 0;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      bVar5 = bVar5 * '\x02' | pcVar2[lVar6] == '1';
    }
    *pcVar1 = bVar5;
    pcVar2 = pcVar2 + 8;
  }
  str_local.value._0_8_ = this;
  Finalize(str_00);
  return;
}

Assistant:

const char *GetData() const {
		return IsInlined() ? const_char_ptr_cast(value.inlined.inlined) : value.pointer.ptr;
	}